

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O0

QList<int> * __thiscall QPlatformFontDatabase::standardSizes(QPlatformFontDatabase *this)

{
  back_insert_iterator<QList<int>_> __first;
  QList<int> *in_RDI;
  QList<int> *ret;
  qsizetype in_stack_00000038;
  QList<int> *__x;
  uchar *in_stack_ffffffffffffffd8;
  back_insert_iterator<QList<int>_> __result;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __x = in_RDI;
  __result.container = in_RDI;
  QList<int>::QList((QList<int> *)0x78e0d8);
  QList<int>::reserve(__result.container,in_stack_00000038);
  __first = std::back_inserter<QList<int>>(__x);
  std::copy<unsigned_char_const*,std::back_insert_iterator<QList<int>>>
            ((uchar *)__first.container,in_stack_ffffffffffffffd8,__result);
  return in_RDI;
}

Assistant:

QList<int> QPlatformFontDatabase::standardSizes() const
{
    QList<int> ret;
    static const quint8 standard[] =
        { 6, 7, 8, 9, 10, 11, 12, 14, 16, 18, 20, 22, 24, 26, 28, 36, 48, 72 };
    static const int num_standards = int(sizeof standard / sizeof *standard);
    ret.reserve(num_standards);
    std::copy(standard, standard + num_standards, std::back_inserter(ret));
    return ret;
}